

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_138::GlobalRefining::run(GlobalRefining *this,Module *module)

{
  GlobalSet *pGVar1;
  Global *__x;
  undefined8 wasm;
  bool bVar2;
  bool bVar3;
  reference __in;
  type *this_00;
  reference ppGVar4;
  reference ppGVar5;
  PassOptions *pPVar6;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *this_01;
  reference this_02;
  pointer pGVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  PassRunner *pPVar10;
  undefined1 local_340 [8];
  GetUpdater updater;
  Type local_1e0;
  Type newType;
  Type oldType;
  mapped_type *lub;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2_2;
  bool optimized;
  Global *global;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *__range2_1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  unoptimizable;
  GlobalSet *set;
  iterator __end3;
  iterator __begin3;
  vector<wasm::GlobalSet_*,_std::allocator<wasm::GlobalSet_*>_> *__range3;
  type *info;
  type *func;
  _Self local_d8;
  iterator __end2;
  iterator __begin2;
  Map *__range2;
  unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
  lubs;
  anon_class_1_0_00000001 local_71;
  Func local_70;
  undefined1 local_50 [8];
  ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  Module *module_local;
  GlobalRefining *this_local;
  
  analysis._48_8_ = module;
  bVar2 = FeatureSet::hasGC(&module->features);
  wasm = analysis._48_8_;
  if (bVar2) {
    std::
    function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>
    ::
    function<wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::_lambda(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)_1_,void>
              ((function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo&)>
                *)&local_70,&local_71);
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
    ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_50,(Module *)wasm,&local_70);
    std::function<void_(wasm::Function_*,_GlobalInfo_&)>::~function
              ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)&local_70);
    std::
    unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
    ::unordered_map((unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
                     *)&__range2);
    __end2 = std::
             map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
             ::begin((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                      *)&analysis);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
         ::end((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                *)&analysis);
    while (bVar2 = std::operator!=(&__end2,&local_d8), bVar2) {
      __in = std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_GlobalInfo>_>::operator*
                       (&__end2);
      std::
      get<0ul,wasm::Function*const,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo>
                (__in);
      this_00 = std::
                get<1ul,wasm::Function*const,wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo>
                          (__in);
      __end3 = std::vector<wasm::GlobalSet_*,_std::allocator<wasm::GlobalSet_*>_>::begin
                         (&this_00->sets);
      set = (GlobalSet *)
            std::vector<wasm::GlobalSet_*,_std::allocator<wasm::GlobalSet_*>_>::end(&this_00->sets);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wasm::GlobalSet_**,_std::vector<wasm::GlobalSet_*,_std::allocator<wasm::GlobalSet_*>_>_>
                                         *)&set), bVar2) {
        ppGVar4 = __gnu_cxx::
                  __normal_iterator<wasm::GlobalSet_**,_std::vector<wasm::GlobalSet_*,_std::allocator<wasm::GlobalSet_*>_>_>
                  ::operator*(&__end3);
        pGVar1 = *ppGVar4;
        pmVar9 = std::
                 unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
                               *)&__range2,&pGVar1->name);
        unoptimizable._M_h._M_single_bucket = (__node_base_ptr)(pGVar1->value->type).id;
        LUBFinder::note(pmVar9,(Type)unoptimizable._M_h._M_single_bucket);
        __gnu_cxx::
        __normal_iterator<wasm::GlobalSet_**,_std::vector<wasm::GlobalSet_*,_std::allocator<wasm::GlobalSet_*>_>_>
        ::operator++(&__end3);
      }
      std::_Rb_tree_iterator<std::pair<wasm::Function_*const,_GlobalInfo>_>::operator++(&__end2);
    }
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&__range2_1);
    ExportUtils::getExportedGlobals
              ((vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)&__begin2_1,
               (Module *)analysis._48_8_);
    __end2_1 = std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>::begin
                         ((vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)&__begin2_1);
    global = (Global *)
             std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>::end
                       ((vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)&__begin2_1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<wasm::Global_**,_std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>_>
                               *)&global), bVar2) {
      ppGVar5 = __gnu_cxx::
                __normal_iterator<wasm::Global_**,_std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>_>
                ::operator*(&__end2_1);
      __x = *ppGVar5;
      pPVar6 = Pass::getPassOptions(&this->super_Pass);
      if (((pPVar6->closedWorld & 1U) != 0) || ((__x->mutable_ & 1U) != 0)) {
        std::
        unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
        ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)&__range2_1,(value_type *)__x);
      }
      __gnu_cxx::
      __normal_iterator<wasm::Global_**,_std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>::~vector
              ((vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)&__begin2_1);
    bVar2 = false;
    this_01 = (vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               *)(analysis._48_8_ + 0x30);
    __end2_2 = std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::begin(this_01);
    global_1 = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
               std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::end(this_01);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                               *)&global_1), bVar3) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                ::operator*(&__end2_2);
      pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         (this_02);
      bVar3 = Importable::imported(&pGVar7->super_Importable);
      if (!bVar3) {
        pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (this_02);
        sVar8 = std::
                unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)&__range2_1,(key_type *)pGVar7);
        if (sVar8 == 0) {
          pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             (this_02);
          pmVar9 = std::
                   unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
                   ::operator[]((unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
                                 *)&__range2,(key_type *)pGVar7);
          pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                             (this_02);
          LUBFinder::note(pmVar9,(Type)(pGVar7->init->type).id);
          bVar3 = LUBFinder::noted(pmVar9);
          if (bVar3) {
            pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                               (this_02);
            newType.id = (pGVar7->type).id;
            local_1e0 = LUBFinder::getLUB(pmVar9);
            bVar3 = wasm::Type::operator!=(&local_1e0,&newType);
            if (bVar3) {
              bVar2 = wasm::Type::isSubType(local_1e0,newType);
              if (!bVar2) {
                __assert_fail("Type::isSubType(newType, oldType)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalRefining.cpp"
                              ,0x6b,
                              "virtual void wasm::(anonymous namespace)::GlobalRefining::run(Module *)"
                             );
              }
              pGVar7 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                                 (this_02);
              (pGVar7->type).id = local_1e0.id;
              bVar2 = true;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end2_2);
    }
    if (bVar2) {
      wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GetUpdater::GetUpdater(wasm::
      (anonymous_namespace)::GlobalRefining&,wasm::Module__
                (local_340,this,(Module *)analysis._48_8_);
      pPVar10 = Pass::getPassRunner(&this->super_Pass);
      WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_> *)
                 local_340,pPVar10,(Module *)analysis._48_8_);
      pPVar10 = Pass::getPassRunner(&this->super_Pass);
      WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>::runOnModuleCode
                ((WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_> *)
                 local_340,pPVar10,(Module *)analysis._48_8_);
      run::GetUpdater::~GetUpdater((GetUpdater *)local_340);
    }
    updater._325_3_ = 0;
    updater._324_1_ = !bVar2;
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&__range2_1);
    std::
    unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
    ::~unordered_map((unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
                      *)&__range2);
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
    ~ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_50);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the global.sets.

    struct GlobalInfo {
      std::vector<GlobalSet*> sets;
    };

    ModuleUtils::ParallelFunctionAnalysis<GlobalInfo> analysis(
      *module, [&](Function* func, GlobalInfo& info) {
        if (func->imported()) {
          return;
        }
        info.sets = std::move(FindAll<GlobalSet>(func->body).list);
      });

    // A map of globals to the lub for that global.
    std::unordered_map<Name, LUBFinder> lubs;

    // Combine all the information we gathered and compute lubs.
    for (auto& [func, info] : analysis.map) {
      for (auto* set : info.sets) {
        lubs[set->name].note(set->value->type);
      }
    }

    // In closed world we cannot change the types of exports, as we might change
    // from a public type to a private that would cause a validation error.
    // TODO We could refine to a type that is still public, however.
    //
    // We are also limited in open world: in that mode we must assume that
    // another module might import our exported globals with the current type
    // (that type is a contract between them), and in such a case the type of
    // mutable globals must match precisely (the same rule as for mutable struct
    // fields in subtypes - the types must match exactly, or else a write in
    // one place could store a type considered in valid in another place).
    std::unordered_set<Name> unoptimizable;
    for (auto* global : ExportUtils::getExportedGlobals(*module)) {
      if (getPassOptions().closedWorld || global->mutable_) {
        unoptimizable.insert(global->name);
      }
    }

    bool optimized = false;

    for (auto& global : module->globals) {
      if (global->imported() || unoptimizable.count(global->name)) {
        continue;
      }

      auto& lub = lubs[global->name];

      // Note the initial value.
      lub.note(global->init->type);

      // The initial value cannot be unreachable, but it might be null, and all
      // other values might be too. In that case, we've noted nothing useful
      // and we can move on.
      if (!lub.noted()) {
        continue;
      }

      auto oldType = global->type;
      auto newType = lub.getLUB();
      if (newType != oldType) {
        // We found an improvement!
        assert(Type::isSubType(newType, oldType));
        global->type = newType;
        optimized = true;
      }
    }

    if (!optimized) {
      return;
    }

    // Update function contents for their new parameter types: global.gets must
    // now return the new type for any globals that we modified.
    struct GetUpdater : public WalkerPass<PostWalker<GetUpdater>> {
      bool isFunctionParallel() override { return true; }

      // Only modifies global.get operations.
      bool requiresNonNullableLocalFixups() override { return false; }

      GlobalRefining& parent;
      Module& wasm;

      GetUpdater(GlobalRefining& parent, Module& wasm)
        : parent(parent), wasm(wasm) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<GetUpdater>(parent, wasm);
      }

      // If we modify anything in a function then we must refinalize so that
      // types propagate outwards.
      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        auto oldType = curr->type;
        auto newType = wasm.getGlobal(curr->name)->type;
        if (newType != oldType) {
          curr->type = newType;
          modified = true;
        }
      }

      void visitFunction(Function* curr) {
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, &wasm);
        }
      }
    } updater(*this, *module);
    updater.run(getPassRunner(), module);
    updater.runOnModuleCode(getPassRunner(), module);
  }